

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

char * __thiscall
cmsys::SystemInformationImplementation::GetVendorID(SystemInformationImplementation *this)

{
  SystemInformationImplementation *this_local;
  
  switch(this->ChipManufacturer) {
  case AMD:
    this_local = (SystemInformationImplementation *)0x8d625a;
    break;
  case Intel:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da62c9;
    break;
  case NSC:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da62eb;
    break;
  case UMC:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da632f;
    break;
  case Cyrix:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da62f6;
    break;
  case NexGen:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da630d;
    break;
  case IDT:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da6324;
    break;
  case Rise:
    this_local = (SystemInformationImplementation *)0x8d638b;
    break;
  case Transmeta:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da6351;
    break;
  case Sun:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da635c;
    break;
  case IBM:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da6373;
    break;
  case Motorola:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da638a;
    break;
  case HP:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da63a1;
    break;
  case Hygon:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da63b8;
    break;
  case UnknownManufacturer:
  default:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_da63cf;
  }
  return (char *)this_local;
}

Assistant:

const char* SystemInformationImplementation::GetVendorID()
{
  // Return the vendor ID.
  switch (this->ChipManufacturer) {
    case Intel:
      return "Intel Corporation";
    case AMD:
      return "Advanced Micro Devices";
    case NSC:
      return "National Semiconductor";
    case Cyrix:
      return "Cyrix Corp., VIA Inc.";
    case NexGen:
      return "NexGen Inc., Advanced Micro Devices";
    case IDT:
      return "IDT\\Centaur, Via Inc.";
    case UMC:
      return "United Microelectronics Corp.";
    case Rise:
      return "Rise";
    case Transmeta:
      return "Transmeta";
    case Sun:
      return "Sun Microelectronics";
    case IBM:
      return "IBM";
    case Motorola:
      return "Motorola";
    case HP:
      return "Hewlett-Packard";
    case Hygon:
      return "Chengdu Haiguang IC Design Co., Ltd.";
    case UnknownManufacturer:
    default:
      return "Unknown Manufacturer";
  }
}